

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

int binbuf_write(_binbuf *x,char *filename,char *dir,int crflag)

{
  t_atomtype tVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  FILE *__s;
  long lVar6;
  char *buf;
  char *pcVar7;
  t_atom *a;
  char fbuf [1000];
  char sbuf [4096];
  _binbuf *local_1438;
  char local_1428 [999];
  undefined1 local_1041;
  char local_1038 [4096];
  undefined1 local_38 [8];
  
  if (*dir == '\0') {
    snprintf(local_1428,999,"%s",filename);
  }
  else {
    snprintf(local_1428,999,"%s/%s",dir,filename);
  }
  local_1041 = 0;
  sVar5 = strlen(filename);
  iVar4 = strcmp(filename + (sVar5 - 4),".pat");
  if ((iVar4 == 0) || (iVar4 = strcmp(filename + (sVar5 - 4),".mxt"), iVar4 == 0)) {
    x = binbuf_convert(x,0);
    local_1438 = x;
  }
  else {
    local_1438 = (_binbuf *)0x0;
  }
  __s = (FILE *)sys_fopen(local_1428,"w");
  if (__s != (FILE *)0x0) {
    iVar4 = x->b_n;
    pcVar7 = local_1038;
    if (iVar4 != 0) {
      a = x->b_vec;
      pcVar7 = local_1038;
      do {
        if ((a->a_type == A_DOLLSYM) || (lVar6 = 0x28, a->a_type == A_SYMBOL)) {
          sVar5 = strlen(((a->a_w).w_symbol)->s_name);
          lVar6 = (long)((int)sVar5 + 0x50);
        }
        buf = pcVar7;
        if (((long)(local_38 + -(long)pcVar7) < lVar6) &&
           (sVar5 = fwrite(local_1038,(long)pcVar7 - (long)local_1038,1,__s), buf = local_1038,
           sVar5 == 0)) {
          bVar2 = false;
        }
        else {
          tVar1 = a->a_type;
          if (((tVar1 == A_SEMI) || (tVar1 == A_COMMA)) && ((local_1038 < buf && (buf[-1] == ' '))))
          {
            buf = buf + -1;
          }
          if ((crflag == 0) || (tVar1 != A_SEMI)) {
            atom_string(a,buf,((int)local_38 - (int)buf) - 2);
            sVar5 = strlen(buf);
            buf = buf + (int)sVar5;
          }
          cVar3 = ' ';
          if (a->a_type == A_SEMI) {
            cVar3 = '\n';
          }
          *buf = cVar3;
          pcVar7 = buf + 1;
          bVar2 = true;
        }
        if (!bVar2) goto LAB_0016a275;
        iVar4 = iVar4 + -1;
        a = a + 1;
      } while (iVar4 != 0);
    }
    sVar5 = fwrite(local_1038,(long)pcVar7 - (long)local_1038,1,__s);
    if ((sVar5 != 0) && (iVar4 = fflush(__s), iVar4 == 0)) {
      iVar4 = 0;
      if (local_1438 != (_binbuf *)0x0) {
        freebytes(local_1438->b_vec,(long)local_1438->b_n << 4);
        freebytes(local_1438,0x10);
      }
      goto LAB_0016a2a5;
    }
  }
LAB_0016a275:
  if (local_1438 != (_binbuf *)0x0) {
    freebytes(local_1438->b_vec,(long)local_1438->b_n << 4);
    freebytes(local_1438,0x10);
  }
  iVar4 = 1;
  if (__s == (FILE *)0x0) {
    return 1;
  }
LAB_0016a2a5:
  fclose(__s);
  return iVar4;
}

Assistant:

int binbuf_write(const t_binbuf *x, const char *filename, const char *dir, int crflag)
{
    FILE *f = 0;
    char sbuf[WBUFSIZE], fbuf[MAXPDSTRING], *bp = sbuf, *ep = sbuf + WBUFSIZE;
    t_atom *ap;
    t_binbuf *y = 0;
    const t_binbuf *z = x;
    int indx;

    if (*dir)
        snprintf(fbuf, MAXPDSTRING-1, "%s/%s", dir, filename);
    else
        snprintf(fbuf, MAXPDSTRING-1, "%s", filename);
    fbuf[MAXPDSTRING-1] = 0;

    if (!strcmp(filename + strlen(filename) - 4, ".pat") ||
        !strcmp(filename + strlen(filename) - 4, ".mxt"))
    {
        y = binbuf_convert(x, 0);
        z = y;
    }

    if (!(f = sys_fopen(fbuf, "w")))
        goto fail;
    for (ap = z->b_vec, indx = z->b_n; indx--; ap++)
    {
        int length;
            /* estimate how many characters will be needed.  Printing out
            symbols may need extra characters for inserting backslashes. */
        if (ap->a_type == A_SYMBOL || ap->a_type == A_DOLLSYM)
            length = 80 + (int)strlen(ap->a_w.w_symbol->s_name);
        else length = 40;
        if (ep - bp < length)
        {
            if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
                goto fail;
            bp = sbuf;
        }
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
            bp > sbuf && bp[-1] == ' ') bp--;
        if (!crflag || ap->a_type != A_SEMI)
        {
            atom_string(ap, bp, (unsigned int)((ep-bp)-2));
            length = (int)strlen(bp);
            bp += length;
        }
        if (ap->a_type == A_SEMI)
        {
            *bp++ = '\n';
        }
        else
        {
            *bp++ = ' ';
        }
    }
    if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
        goto fail;

    if (fflush(f) != 0)
        goto fail;

    if (y)
        binbuf_free(y);
    fclose(f);
    return (0);
fail:
    if (y)
        binbuf_free(y);
    if (f)
        fclose(f);
    return (1);
}